

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O1

void fixmap(KEYMAP *curmap,KEYMAP *mp,KEYMAP *mt)

{
  KEYMAP *mt_00;
  keymap_s **ppkVar1;
  long lVar2;
  
  lVar2 = (long)mt->map_num;
  if (lVar2 != 0) {
    ppkVar1 = &mt->map_element[lVar2 + -1].k_prefmap;
    do {
      mt_00 = *ppkVar1;
      if (mt_00 != (KEYMAP *)0x0) {
        if (mt_00 == curmap) {
          *ppkVar1 = mp;
        }
        else {
          fixmap(curmap,mp,mt_00);
        }
      }
      lVar2 = lVar2 + -1;
      ppkVar1 = ppkVar1 + -3;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

static void
fixmap(KEYMAP *curmap, KEYMAP *mp, KEYMAP *mt)
{
	int	 i;

	for (i = mt->map_num; i--;) {
		if (mt->map_element[i].k_prefmap != NULL) {
			if (mt->map_element[i].k_prefmap == curmap)
				mt->map_element[i].k_prefmap = mp;
			else
				fixmap(curmap, mp, mt->map_element[i].k_prefmap);
		}
	}
}